

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_zip.cpp
# Opt level: O2

bool __thiscall FZipFile::Open(FZipFile *this,bool quiet)

{
  ushort uVar1;
  FileReader *pFVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  long lVar7;
  ulong *puVar8;
  void *__ptr;
  uint uVar9;
  ulong uVar10;
  FZipLump *pFVar11;
  char *pcVar12;
  char *format;
  void *pvVar13;
  void *pvVar14;
  size_t __size;
  int iVar15;
  uint uVar16;
  int local_468;
  FString name;
  FString local_440;
  FZipEndOfCentralDirectory info;
  
  pFVar2 = (this->super_FResourceFile).Reader;
  (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar2,0,2);
  uVar4 = (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[3])(pFVar2);
  uVar16 = 0xffff;
  if (uVar4 < 0xffff) {
    uVar16 = uVar4;
  }
  uVar10 = 4;
  do {
    if (uVar16 <= (uint)uVar10) {
LAB_004c4c25:
      this->Lumps = (FZipLump *)0x0;
      if (!quiet) {
        pcVar12 = (this->super_FResourceFile).Filename;
        format = "\x1cG\n%s: ZIP file corrupt!\n";
LAB_004c4c45:
        Printf(format,pcVar12);
      }
      return false;
    }
    uVar9 = (uint)uVar10 + 0x400;
    uVar3 = uVar16;
    if (uVar9 < uVar16) {
      uVar3 = uVar9;
    }
    uVar10 = (ulong)uVar3;
    uVar6 = 0x404;
    if (uVar3 < 0x404) {
      uVar6 = uVar10;
    }
    iVar5 = (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (pFVar2,(ulong)(uVar4 - uVar3),0);
    if (CONCAT44(extraout_var,iVar5) != 0) goto LAB_004c4c25;
    iVar15 = (int)uVar6;
    iVar5 = (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&info,uVar6);
    if (CONCAT44(extraout_var_00,iVar5) != uVar6) goto LAB_004c4c25;
    uVar6 = (ulong)(iVar15 - 3);
    for (lVar7 = 0; iVar5 = (int)lVar7, 0 < iVar5 + iVar15 + -3; lVar7 = lVar7 + -1) {
      if ((((*(char *)((long)&local_440.Chars + lVar7 + uVar6 + 7) == 'P') &&
           (*(char *)((long)&info.Magic + lVar7 + uVar6) == 'K')) &&
          (*(char *)((long)&info.Magic + lVar7 + uVar6 + 1) == '\x05')) &&
         (*(char *)((long)&info.Magic + lVar7 + uVar6 + 2) == '\x06')) {
        if (iVar5 + ((iVar15 + (uVar4 - 4)) - uVar3) != 0) {
          this->Lumps = (FZipLump *)0x0;
          if (uVar4 <= uVar9) {
            uVar9 = uVar4;
          }
          uVar16 = 0x404;
          if (uVar9 < 0x404) {
            uVar16 = uVar9;
          }
          if (0xfffe < uVar9) {
            uVar9 = 0xffff;
          }
          pFVar2 = (this->super_FResourceFile).Reader;
          (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
                    (pFVar2,(ulong)((((uVar16 + uVar4) - uVar9) + iVar5) - 4),0);
          pFVar2 = (this->super_FResourceFile).Reader;
          (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,&info,0x16);
          uVar10 = (ulong)info.NumEntries;
          if (((info.NumEntries == info.NumEntriesOnAllDisks) && (info.FirstDisk == 0)) &&
             (info.DiskNumber == 0)) {
            (this->super_FResourceFile).NumLumps = (uint)info.NumEntries;
            puVar8 = (ulong *)operator_new__(uVar10 * 0x60 | 8);
            *puVar8 = uVar10;
            if (info.NumEntries != 0) {
              lVar7 = 0;
              pFVar11 = (FZipLump *)(puVar8 + 1);
              do {
                FZipLump::FZipLump(pFVar11);
                lVar7 = lVar7 + -0x60;
                pFVar11 = pFVar11 + 1;
              } while (uVar10 * -0x60 - lVar7 != 0);
            }
            this->Lumps = (FZipLump *)(puVar8 + 1);
            __size = (size_t)(int)info.DirectorySize;
            __ptr = malloc(__size);
            pFVar2 = (this->super_FResourceFile).Reader;
            (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (pFVar2,(ulong)info.DirectoryOffset,0);
            pFVar2 = (this->super_FResourceFile).Reader;
            (*(pFVar2->super_FileReaderBase)._vptr_FileReaderBase[2])(pFVar2,__ptr,__size);
            pFVar11 = this->Lumps;
            uVar16 = 0;
            local_468 = 0;
            pvVar13 = __ptr;
            do {
              uVar4 = (this->super_FResourceFile).NumLumps;
              if (uVar4 <= uVar16) {
                uVar4 = uVar4 - local_468;
                (this->super_FResourceFile).NumLumps = uVar4;
                free(__ptr);
                if ((!quiet) && (batchrun == false)) {
                  Printf("\x1c-, %d lumps\n",(ulong)uVar4);
                }
                FResourceFile::PostProcessArchive(&this->super_FResourceFile,this->Lumps,0x60);
                return true;
              }
              uVar1 = *(ushort *)((long)pvVar13 + 0x1c);
              FString::FString(&name,(char *)((long)pvVar13 + 0x2e),(ulong)uVar1);
              pvVar14 = (void *)((long)pvVar13 +
                                (ulong)*(ushort *)((long)pvVar13 + 0x20) +
                                (ulong)*(ushort *)((long)pvVar13 + 0x1e) +
                                (ulong)*(ushort *)((long)pvVar13 + 0x1c) + 0x2e);
              if ((void *)((long)__ptr + __size) < pvVar14) {
                free(__ptr);
                if (!quiet) {
                  Printf("\x1cG\n%s: Central directory corrupted.",
                         (this->super_FResourceFile).Filename);
                }
                FString::~FString(&name);
                return false;
              }
              if ((name.Chars[(ulong)uVar1 - 1] == '/') && (*(int *)((long)pvVar13 + 0x18) == 0)) {
                local_468 = local_468 + 1;
              }
              else {
                if ((*(ushort *)((long)pvVar13 + 10) < 0xf) &&
                   ((0x5143U >> (*(ushort *)((long)pvVar13 + 10) & 0x1f) & 1) != 0)) {
                  if ((*(byte *)((long)pvVar13 + 8) & 1) == 0) {
                    FString::ReplaceChars(&name,'\\','/');
                    FString::ToLower(&name);
                    FString::AttachToOther(&local_440,&name);
                    FResourceLump::LumpNameSetup(&pFVar11->super_FResourceLump,&local_440);
                    FString::~FString(&local_440);
                    (pFVar11->super_FResourceLump).LumpSize = *(int *)((long)pvVar13 + 0x18);
                    (pFVar11->super_FResourceLump).Owner = &this->super_FResourceFile;
                    (pFVar11->super_FResourceLump).Flags = 0x82;
                    (pFVar11->super_FResourceLump).field_0x4e = *(undefined1 *)((long)pvVar13 + 10);
                    *(undefined2 *)&(pFVar11->super_FResourceLump).field_0x4c =
                         *(undefined2 *)((long)pvVar13 + 8);
                    pFVar11->CRC32 = *(uint *)((long)pvVar13 + 0x10);
                    pFVar11->CompressedSize = *(int *)((long)pvVar13 + 0x14);
                    pFVar11->Position = *(int *)((long)pvVar13 + 0x2a);
                    FResourceLump::CheckEmbedded(&pFVar11->super_FResourceLump);
                    iVar5 = strcasecmp("dehacked.exe",name.Chars);
                    if (iVar5 == 0) {
                      (pFVar11->super_FResourceLump).field_3.Name[8] = '\0';
                      (pFVar11->super_FResourceLump).field_3.qwName = 0;
                    }
                    pFVar11 = pFVar11 + 1;
                    goto LAB_004c4c13;
                  }
                  if (!quiet) {
                    Printf("\x1cK\n%s: \'%s\' is encrypted. Encryption is not supported.\n",
                           (this->super_FResourceFile).Filename);
                  }
                }
                else if (!quiet) {
                  Printf("\x1cK\n%s: \'%s\' uses an unsupported compression algorithm (#%d).\n",
                         (this->super_FResourceFile).Filename);
                }
                local_468 = local_468 + 1;
              }
LAB_004c4c13:
              FString::~FString(&name);
              uVar16 = uVar16 + 1;
              pvVar13 = pvVar14;
            } while( true );
          }
          if (quiet) {
            return false;
          }
          pcVar12 = (this->super_FResourceFile).Filename;
          format = "\x1cG\n%s: Multipart Zip files are not supported.\n";
          goto LAB_004c4c45;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

bool FZipFile::Open(bool quiet)
{
	DWORD centraldir = Zip_FindCentralDir(Reader);
	FZipEndOfCentralDirectory info;
	int skipped = 0;

	Lumps = NULL;

	if (centraldir == 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: ZIP file corrupt!\n", Filename);
		return false;
	}

	// Read the central directory info.
	Reader->Seek(centraldir, SEEK_SET);
	Reader->Read(&info, sizeof(FZipEndOfCentralDirectory));

	// No multi-disk zips!
	if (info.NumEntries != info.NumEntriesOnAllDisks ||
		info.FirstDisk != 0 || info.DiskNumber != 0)
	{
		if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Multipart Zip files are not supported.\n", Filename);
		return false;
	}

	NumLumps = LittleShort(info.NumEntries);
	Lumps = new FZipLump[NumLumps];

	// Load the entire central directory. Too bad that this contains variable length entries...
	int dirsize = LittleLong(info.DirectorySize);
	void *directory = malloc(dirsize);
	Reader->Seek(LittleLong(info.DirectoryOffset), SEEK_SET);
	Reader->Read(directory, dirsize);

	char *dirptr = (char*)directory;
	FZipLump *lump_p = Lumps;
	for (DWORD i = 0; i < NumLumps; i++)
	{
		FZipCentralDirectoryInfo *zip_fh = (FZipCentralDirectoryInfo *)dirptr;

		int len = LittleShort(zip_fh->NameLength);
		FString name(dirptr + sizeof(FZipCentralDirectoryInfo), len);
		dirptr += sizeof(FZipCentralDirectoryInfo) + 
				  LittleShort(zip_fh->NameLength) + 
				  LittleShort(zip_fh->ExtraLength) + 
				  LittleShort(zip_fh->CommentLength);

		if (dirptr > ((char*)directory) + dirsize)	// This directory entry goes beyond the end of the file.
		{
			free(directory);
			if (!quiet) Printf(TEXTCOLOR_RED "\n%s: Central directory corrupted.", Filename);
			return false;
		}
		
		// skip Directories
		if (name[len - 1] == '/' && LittleLong(zip_fh->UncompressedSize) == 0) 
		{
			skipped++;
			continue;
		}

		// Ignore unknown compression formats
		zip_fh->Method = LittleShort(zip_fh->Method);
		if (zip_fh->Method != METHOD_STORED &&
			zip_fh->Method != METHOD_DEFLATE &&
			zip_fh->Method != METHOD_LZMA &&
			zip_fh->Method != METHOD_BZIP2 &&
			zip_fh->Method != METHOD_IMPLODE &&
			zip_fh->Method != METHOD_SHRINK)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' uses an unsupported compression algorithm (#%d).\n", Filename, name.GetChars(), zip_fh->Method);
			skipped++;
			continue;
		}
		// Also ignore encrypted entries
		zip_fh->Flags = LittleShort(zip_fh->Flags);
		if (zip_fh->Flags & ZF_ENCRYPTED)
		{
			if (!quiet) Printf(TEXTCOLOR_YELLOW "\n%s: '%s' is encrypted. Encryption is not supported.\n", Filename, name.GetChars());
			skipped++;
			continue;
		}

		FixPathSeperator(name);
		name.ToLower();

		lump_p->LumpNameSetup(name);
		lump_p->LumpSize = LittleLong(zip_fh->UncompressedSize);
		lump_p->Owner = this;
		// The start of the Reader will be determined the first time it is accessed.
		lump_p->Flags = LUMPF_ZIPFILE | LUMPFZIP_NEEDFILESTART;
		lump_p->Method = BYTE(zip_fh->Method);
		lump_p->GPFlags = zip_fh->Flags;
		lump_p->CRC32 = zip_fh->CRC32;
		lump_p->CompressedSize = LittleLong(zip_fh->CompressedSize);
		lump_p->Position = LittleLong(zip_fh->LocalHeaderOffset);
		lump_p->CheckEmbedded();

		// Ignore some very specific names
		if (0 == stricmp("dehacked.exe", name))
		{
			memset(lump_p->Name, 0, sizeof(lump_p->Name));
		}

		lump_p++;
	}
	// Resize the lump record array to its actual size
	NumLumps -= skipped;
	free(directory);

	if (!quiet && !batchrun) Printf(TEXTCOLOR_NORMAL ", %d lumps\n", NumLumps);
	
	PostProcessArchive(&Lumps[0], sizeof(FZipLump));
	return true;
}